

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::Clear(ItemSimilarityRecommender *this)

{
  StringVector *this_00;
  Int64Vector *this_01;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  ItemSimilarityRecommender *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
  ::Clear(&this->itemitemsimilarities_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->iteminputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->numrecommendationsinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->itemrestrictioninputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->itemexclusioninputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->recommendeditemlistoutputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->recommendeditemscoreoutputfeaturename_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->itemstringids_ != (StringVector *)0x0)) &&
     (this_00 = this->itemstringids_, this_00 != (StringVector *)0x0)) {
    StringVector::~StringVector(this_00);
    operator_delete(this_00,0x30);
  }
  this->itemstringids_ = (StringVector *)0x0;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->itemint64ids_ != (Int64Vector *)0x0)) &&
     (this_01 = this->itemint64ids_, this_01 != (Int64Vector *)0x0)) {
    Int64Vector::~Int64Vector(this_01);
    operator_delete(this_01,0x28);
  }
  this->itemint64ids_ = (Int64Vector *)0x0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ItemSimilarityRecommender::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ItemSimilarityRecommender)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  itemitemsimilarities_.Clear();
  iteminputfeaturename_.ClearToEmpty();
  numrecommendationsinputfeaturename_.ClearToEmpty();
  itemrestrictioninputfeaturename_.ClearToEmpty();
  itemexclusioninputfeaturename_.ClearToEmpty();
  recommendeditemlistoutputfeaturename_.ClearToEmpty();
  recommendeditemscoreoutputfeaturename_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && itemstringids_ != nullptr) {
    delete itemstringids_;
  }
  itemstringids_ = nullptr;
  if (GetArenaForAllocation() == nullptr && itemint64ids_ != nullptr) {
    delete itemint64ids_;
  }
  itemint64ids_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}